

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.h
# Opt level: O2

void __thiscall miniros::TopicInfo::TopicInfo(TopicInfo *this,string *_name,string *_datatype)

{
  std::__cxx11::string::string((string *)this,(string *)_name);
  std::__cxx11::string::string((string *)&this->datatype,(string *)_datatype);
  return;
}

Assistant:

TopicInfo(const std::string& _name, const std::string& _datatype /*, const std::string& _md5sum*/)
      : name(_name), datatype(_datatype)
  //, md5sum(_md5sum)
  {
  }